

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::~call_matcher
          (call_matcher<void_(),_std::tuple<>_> *this)

{
  sequence_handler_base *psVar1;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar2;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar3;
  return_handler<void_()> *prVar4;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> uStack_18;
  
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  ._vptr_list_elem = (_func_int **)&PTR__call_matcher_0018ad70;
  (this->super_expectation)._vptr_expectation = (_func_int **)&DAT_0018add8;
  get_lock<void>();
  if (this->reported == false) {
    list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
              ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this);
    if (((call_matcher<void_(),_std::tuple<>_> *)
         (this->super_call_matcher_base<void_()>).
         super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next != this) &&
       (psVar1 = (this->sequences)._M_t.
                 super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
                 .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl,
       psVar1->call_count < psVar1->min_calls)) {
      report_missed(this,"Unfulfilled expectation");
    }
  }
  list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
            ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this);
  plVar2 = (this->super_call_matcher_base<void_()>).
           super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next;
  plVar3 = (this->super_call_matcher_base<void_()>).
           super_list_elem<trompeloeil::call_matcher_base<void_()>_>.prev;
  plVar2->prev = plVar3;
  plVar3->next = plVar2;
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  .next = (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  .prev = (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
  list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
            ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this);
  Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_18);
  psVar1 = (this->sequences)._M_t.
           super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
           .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
  if (psVar1 != (sequence_handler_base *)0x0) {
    (*psVar1->_vptr_sequence_handler_base[1])();
  }
  (this->sequences)._M_t.
  super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
  .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl =
       (sequence_handler_base *)0x0;
  prVar4 = (this->return_handler_obj)._M_t.
           super___uniq_ptr_impl<trompeloeil::return_handler<void_()>,_std::default_delete<trompeloeil::return_handler<void_()>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_trompeloeil::return_handler<void_()>_*,_std::default_delete<trompeloeil::return_handler<void_()>_>_>
           .super__Head_base<0UL,_trompeloeil::return_handler<void_()>_*,_false>._M_head_impl;
  if (prVar4 != (return_handler<void_()> *)0x0) {
    (**(code **)(*(long *)prVar4 + 8))();
  }
  (this->return_handler_obj)._M_t.
  super___uniq_ptr_impl<trompeloeil::return_handler<void_()>,_std::default_delete<trompeloeil::return_handler<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_trompeloeil::return_handler<void_()>_*,_std::default_delete<trompeloeil::return_handler<void_()>_>_>
  .super__Head_base<0UL,_trompeloeil::return_handler<void_()>_*,_false>._M_head_impl =
       (return_handler<void_()> *)0x0;
  list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer>::~list(&this->actions);
  list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer>::~list(&this->conditions)
  ;
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  ._vptr_list_elem = (_func_int **)&PTR__list_elem_0018ad50;
  list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
            ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this);
  plVar2 = (this->super_call_matcher_base<void_()>).
           super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next;
  plVar3 = (this->super_call_matcher_base<void_()>).
           super_list_elem<trompeloeil::call_matcher_base<void_()>_>.prev;
  plVar2->prev = plVar3;
  plVar3->next = plVar2;
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  .next = (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  .prev = (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this;
  list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
            ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this);
  return;
}

Assistant:

~call_matcher() override
    {
      auto lock = get_lock();
      if (is_unfulfilled())
      {
        report_missed("Unfulfilled expectation");
      }
      this->unlink();
    }